

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

int32 commit(int32 mixw_reest,int32 tmat_reest,int32 mean_reest,int32 var_reest,int32 ckpt,
            char *out_dir)

{
  int iVar1;
  FILE *__stream;
  char fn [4097];
  char fn_bkp [4097];
  
  if (mixw_reest != 0) {
    sprintf(fn_bkp,"%s/mixw_counts.bkp",out_dir);
    unlink(fn_bkp);
  }
  if (tmat_reest != 0) {
    sprintf(fn_bkp,"%s/tmat_counts.bkp",out_dir);
    unlink(fn_bkp);
  }
  if (var_reest != 0 || mean_reest != 0) {
    sprintf(fn_bkp,"%s/gauden_counts.bkp",out_dir);
    unlink(fn_bkp);
  }
  sprintf(fn,"%s/ckpt",out_dir);
  if (ckpt == 0) {
    __stream = fopen(fn,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      iVar1 = unlink(fn);
      if (iVar1 < 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                ,0x328,"Unable to unlink checkpoint file\n");
        return -1;
      }
    }
  }
  else {
    iVar1 = corpus_ckpt(fn);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int32
commit(int32 mixw_reest,
       int32 tmat_reest,
       int32 mean_reest,
       int32 var_reest,
       int32 ckpt,
       const char *out_dir)
{
    char fn[MAXPATHLEN+1];
    char fn_bkp[MAXPATHLEN+1];

    /* no problem (other than a bit of wasted space) if
       the unlink()'s below fail */
    if (mixw_reest) {
	sprintf(fn_bkp, "%s/mixw_counts.bkp", out_dir);

	unlink(fn_bkp);
    }
    if (tmat_reest) {
	sprintf(fn_bkp, "%s/tmat_counts.bkp", out_dir);

	unlink(fn_bkp);
    }
    if (mean_reest || var_reest) {
	sprintf(fn_bkp, "%s/gauden_counts.bkp", out_dir);


	unlink(fn_bkp);
    }

    sprintf(fn, "%s/ckpt", out_dir);
    
    if (ckpt) {
	/* write a file containing the current ctl file offset and
	   # of utts to go */
	if (corpus_ckpt(fn) != S3_SUCCESS) {
	    
	    return S3_ERROR;
	}
    }
    else if (!ckpt) {
	FILE *fp;

	fp = fopen(fn, "r");
	if (fp != NULL) {
	    fclose(fp);

	    if (unlink(fn) < 0) {
		E_ERROR("Unable to unlink checkpoint file\n");
		return S3_ERROR;
	    }
	}
    }

    return S3_SUCCESS;
}